

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_66ad7c::TransformActionGenexStrip::operator()
          (string *__return_storage_ptr__,TransformActionGenexStrip *this,string *s)

{
  TransformSelector *pTVar1;
  uint uVar2;
  string *s_local;
  TransformActionGenexStrip *this_local;
  
  pTVar1 = (this->super_TransformAction).Selector;
  uVar2 = (*(pTVar1->super_TransformSelector)._vptr_TransformSelector[4])(pTVar1,s);
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    cmGeneratorExpression::Preprocess(__return_storage_ptr__,s,StripAllGeneratorExpressions,false);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string& s) override
  {
    if (this->Selector->InSelection(s)) {
      return cmGeneratorExpression::Preprocess(
        s, cmGeneratorExpression::StripAllGeneratorExpressions);
    }

    return s;
  }